

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O1

attr_list INT_CMtest_transport(CMConnection conn,attr_list how)

{
  CManager p_Var1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  char *pcVar5;
  size_t sVar6;
  FFSEncodeVector pFVar7;
  size_t sVar8;
  FFSEncodeVector pFVar9;
  void *pvVar10;
  size_t sVar11;
  undefined4 *puVar12;
  pthread_t pVar13;
  long lVar14;
  undefined4 uVar15;
  long lVar16;
  FILE *pFVar17;
  size_t *psVar18;
  CMConnection p_Var19;
  ulong uVar20;
  int vecs;
  int repeat_count;
  int reuse_write_buffer;
  ssize_t size;
  attr_list result;
  int node_id;
  int verbose;
  int header [6];
  timespec ts;
  int local_a4;
  uint local_a0;
  int local_9c;
  size_t local_98;
  CMConnection local_90;
  attr_list local_88;
  int local_80;
  int local_7c;
  undefined4 local_78;
  undefined4 local_74;
  CManager local_70;
  undefined4 local_68;
  undefined8 local_64;
  int local_5c;
  undefined8 local_58;
  FFSEncodeVector local_48;
  timespec local_40;
  
  local_88 = (attr_list)0x0;
  local_a4 = 1;
  local_74 = 0;
  local_a0 = 1;
  local_9c = 1;
  init_atoms();
  iVar2 = INT_CMCondition_get(conn->cm,conn);
  p_Var1 = conn->cm;
  local_90 = conn;
  iVar3 = get_long_attr(how,CM_TRANS_TEST_SIZE,&local_98);
  if (iVar3 == 0) {
    puts("CM_TRANS_TEST_SIZE attr not found by CMtest_transport, required");
    return (attr_list)0x0;
  }
  get_int_attr(how,CM_TRANS_TEST_VECS,&local_a4);
  if (local_a4 < 1) {
    printf("Stupid vecs value in CMtest_transport, %d\n");
    return (attr_list)0x0;
  }
  if (((float)(long)local_98 / (float)local_a4 < 24.0) && (local_a4 = 1, (long)local_98 < 0x18)) {
    local_98 = 0x18;
  }
  get_int_attr(how,CM_TRANS_TEST_VERBOSE,&local_74);
  get_int_attr(how,CM_TRANS_TEST_REPEAT,&local_a0);
  get_int_attr(how,CM_TRANS_TEST_REUSE_WRITE_BUFFER,&local_9c);
  get_int_attr(how,CM_TRANS_TEST_NODE,&local_78);
  pcVar5 = (char *)attr_list_to_string(how);
  sVar6 = strlen(pcVar5);
  p_Var19 = local_90;
  lVar14 = (sVar6 << 0x20) + 0x1900000000;
  local_68 = 0x434d5000;
  uVar15 = 0xfa000000;
  if (lVar14 < 0) {
    uVar15 = 0xfaffffff;
  }
  local_64 = CONCAT44((int)((ulong)lVar14 >> 0x20),uVar15);
  local_58 = 0x18;
  local_5c = iVar2;
  INT_CMCondition_set_client_data(local_90->cm,iVar2,&local_88);
  iVar3 = CMtrace_val[5];
  if (p_Var19->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(p_Var19->cm,CMTransportVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar17 = (FILE *)p_Var19->cm->CMTrace_file;
      _Var4 = getpid();
      pVar13 = pthread_self();
      p_Var19 = local_90;
      fprintf(pFVar17,"P%lxT%lx - ",(long)_Var4,pVar13);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)p_Var19->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)p_Var19->cm->CMTrace_file,
            "CM - Initiating transport test of %zd bytes, %d messages\n",local_98,(ulong)local_a0);
  }
  fflush((FILE *)p_Var19->cm->CMTrace_file);
  iVar3 = CMtrace_val[5];
  if (p_Var19->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(p_Var19->cm,CMTransportVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar17 = (FILE *)p_Var19->cm->CMTrace_file;
      _Var4 = getpid();
      pVar13 = pthread_self();
      p_Var19 = local_90;
      fprintf(pFVar17,"P%lxT%lx - ",(long)_Var4,pVar13);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)p_Var19->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fwrite("CM - transport test, sending first message\n",0x2b,1,(FILE *)p_Var19->cm->CMTrace_file);
  }
  fflush((FILE *)p_Var19->cm->CMTrace_file);
  pFVar7 = (FFSEncodeVector)INT_CMmalloc((long)local_a4 * 0x10 + 0x10);
  pFVar7->iov_base = &local_68;
  pFVar7->iov_len = 0x18;
  pFVar7[1].iov_base = pcVar5;
  sVar6 = strlen(pcVar5);
  pFVar7[1].iov_len = sVar6 + 1;
  iVar3 = INT_CMwrite_raw(p_Var19,pFVar7,(FFSEncodeVector)0x0,2,sVar6 + 0x19,(attr_list)0x0,1);
  free(pcVar5);
  if (iVar3 != 1) {
LAB_00126127:
    free(pFVar7);
    return (attr_list)0x0;
  }
  sVar8 = (long)(local_98 + (long)local_a4 + -1) / (long)local_a4;
  local_80 = iVar2;
  local_70 = p_Var1;
  if ((int)local_a0 < 1) {
    pFVar9 = (FFSEncodeVector)0x0;
  }
  else {
    iVar2 = 0;
    pFVar9 = (FFSEncodeVector)0x0;
    local_48 = pFVar7;
    do {
      if (pFVar9 == (FFSEncodeVector)0x0) {
        local_7c = iVar2;
        pFVar9 = (FFSEncodeVector)INT_CMmalloc((long)local_a4 * 0x10 + 0x20);
        pFVar9->iov_len = 0x14;
        lVar14 = (long)local_a4;
        if (0 < lVar14) {
          lVar16 = (long)(int)local_a0;
          psVar18 = &pFVar9[1].iov_len;
          do {
            pvVar10 = calloc(lVar16 + sVar8,1);
            ((FFSEncodeVec *)(psVar18 + -1))->iov_base = pvVar10;
            *psVar18 = sVar8;
            psVar18 = psVar18 + 2;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        if (0 < local_a4) {
          lVar14 = 0;
          do {
            if (3 < (long)(int)local_a0 + sVar8) {
              uVar20 = 0;
              do {
                iVar2 = rand();
                *(int *)((long)pFVar9[lVar14 + 1].iov_base + uVar20 * 4) = iVar2;
                uVar20 = uVar20 + 1;
              } while (uVar20 < (long)(int)local_a0 + sVar8 >> 2);
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_a4);
        }
        sVar11 = pFVar9[1].iov_len - pFVar9->iov_len;
        if (pFVar9[1].iov_len < pFVar9->iov_len || sVar11 == 0) {
          sVar11 = 1;
        }
        pFVar9[1].iov_len = sVar11;
        iVar2 = local_7c;
      }
      puVar12 = (undefined4 *)INT_CMmalloc(0x14);
      pFVar9->iov_base = puVar12;
      *puVar12 = 0x434d5000;
      puVar12[1] = (uint)(local_98 >> 0x20) & 0xffffff | 0xfb000000;
      puVar12[2] = (int)local_98;
      puVar12[3] = iVar2;
      puVar12[4] = local_78;
      lVar14 = (long)local_a4;
      if (1 < lVar14) {
        pFVar9[lVar14].iov_len = local_98 - (local_a4 - 1) * sVar8;
      }
      pFVar7 = (FFSEncodeVector)INT_CMmalloc(lVar14 * 0x10 + 0x20);
      memcpy(pFVar7,pFVar9,(long)local_a4 * 0x10 + 0x20);
      pvVar10 = INT_CMmalloc(0x20);
      p_Var19 = local_90;
      *(FFSEncodeVector *)((long)pvVar10 + 8) = pFVar7;
      if ((iVar2 == local_a0 - 1) || (local_9c == 0)) {
        *(FFSEncodeVector *)((long)pvVar10 + 0x18) = pFVar9;
        *(int *)((long)pvVar10 + 0x10) = local_a4;
      }
      else {
        *(undefined8 *)((long)pvVar10 + 0x18) = 0;
      }
      iVar3 = INT_CMwrite_raw_notify
                        (local_90,pFVar7,(FFSEncodeVector)0x0,(long)local_a4 + 1,local_98,
                         (attr_list)0x0,0,write_is_done,pvVar10);
      if (local_9c == 0) {
        pFVar9 = (FFSEncodeVector)0x0;
      }
      pFVar7 = pFVar9;
      if (iVar2 == local_a0 - 1) {
        pFVar7 = (FFSEncodeVector)0x0;
      }
      if (iVar3 != 1) goto LAB_00126127;
      if (p_Var19->write_pending != 0) {
        wait_for_pending_write(p_Var19);
      }
      iVar2 = iVar2 + 1;
      pFVar9 = pFVar7;
      pFVar7 = local_48;
    } while (iVar2 < (int)local_a0);
  }
  local_64 = 0x18fc000000;
  if (pFVar9 == (FFSEncodeVector)0x0) {
    pFVar9 = (FFSEncodeVector)INT_CMmalloc(0x10);
  }
  p_Var19 = local_90;
  pFVar9->iov_base = &local_68;
  pFVar9->iov_len = 0x18;
  iVar2 = INT_CMwrite_raw(local_90,pFVar9,(FFSEncodeVector)0x0,1,0x18,(attr_list)0x0,0);
  free(pFVar9);
  free(pFVar7);
  if (iVar2 != 1) {
    return (attr_list)0x0;
  }
  iVar2 = INT_CMCondition_wait(p_Var19->cm,local_80);
  p_Var1 = local_70;
  if (iVar2 == 0) {
    iVar2 = CMtrace_val[5];
    if (local_70->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(local_70,CMTransportVerbose);
    }
    if (iVar2 == 0) goto LAB_001262b1;
    if (CMtrace_PID != 0) {
      pFVar17 = (FILE *)p_Var1->CMTrace_file;
      _Var4 = getpid();
      pVar13 = pthread_self();
      fprintf(pFVar17,"P%lxT%lx - ",(long)_Var4,pVar13);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)p_Var1->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    pFVar17 = (FILE *)p_Var1->CMTrace_file;
    pcVar5 = "CM - Completed transport test CONNECTION FAILED- result %p \n";
  }
  else {
    iVar2 = CMtrace_val[5];
    if (local_70->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(local_70,CMTransportVerbose);
    }
    if (iVar2 == 0) goto LAB_001262b1;
    if (CMtrace_PID != 0) {
      pFVar17 = (FILE *)p_Var1->CMTrace_file;
      _Var4 = getpid();
      pVar13 = pthread_self();
      fprintf(pFVar17,"P%lxT%lx - ",(long)_Var4,pVar13);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)p_Var1->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    pFVar17 = (FILE *)p_Var1->CMTrace_file;
    pcVar5 = "CM - Completed transport test - result %p \n";
  }
  fprintf(pFVar17,pcVar5,local_88);
LAB_001262b1:
  fflush((FILE *)p_Var1->CMTrace_file);
  return local_88;
}

Assistant:

extern attr_list
INT_CMtest_transport(CMConnection conn, attr_list how)
{
    int i;
    int cond;
    attr_list result = NULL;
    long actual;
    struct FFSEncodeVec *write_vec;
    struct FFSEncodeVec *tmp_vec, *header_vec;
    int header[6];
    ssize_t size;
    int vecs = 1;
    int verbose = 0;
    int repeat_count = 1;
    int reuse_write_buffer = 1;
    long start_size, count;
    init_atoms();
    cond = INT_CMCondition_get(conn->cm, conn);
    CManager cm = conn->cm;
    struct _free_struct *write_data;
    int node_id;

    if (!get_long_attr(how, CM_TRANS_TEST_SIZE, &size)) {
	printf("CM_TRANS_TEST_SIZE attr not found by CMtest_transport, required\n");
	return 0;
    }
    get_int_attr(how, CM_TRANS_TEST_VECS, &vecs);
    if (vecs < 1) {
	printf("Stupid vecs value in CMtest_transport, %d\n", vecs);
	return 0;
    }
    if (((float)size / (float) vecs) < 24.0) {
      vecs = 1;
      if (size < 24) {
	size = 24;
      }
    }
    get_int_attr(how, CM_TRANS_TEST_VERBOSE, &verbose);
    get_int_attr(how, CM_TRANS_TEST_REPEAT, &repeat_count);
    get_int_attr(how, CM_TRANS_TEST_REUSE_WRITE_BUFFER, &reuse_write_buffer);
    get_int_attr(how, CM_TRANS_TEST_NODE, &node_id);
    char *attr_str = attr_list_to_string(how);

    
    start_size = (int)strlen(attr_str) + (int)sizeof(header) + 1;
    /* CMP\0 in first entry for CMPerformance message */
    ((int*)header)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
    ((int*)header)[1] = (CMPerfTestInit<<24);
#else
    ((int*)header)[1] = ((start_size >> 32) &0xffffff) | (CMPerfTestInit<<24);
#endif
    ((int*)header)[2] = (start_size & 0xffffffff);
    ((int*)header)[3] = cond;   /* condition value in third entry */
    ((int*)header)[4] = sizeof(header);   /* header size 4th entry */
    ((int*)header)[5] = 0;
    INT_CMCondition_set_client_data( conn->cm, cond, &result);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Initiating transport test of %zd bytes, %d messages\n", size, repeat_count);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - transport test, sending first message\n");

    header_vec = malloc(sizeof(header_vec[0]) * (vecs + 1));  /* at least 2 */
    header_vec[0].iov_base = &header[0];
    header_vec[0].iov_len = sizeof(header);
    header_vec[1].iov_base = attr_str;
    header_vec[1].iov_len = strlen(attr_str) + 1; /* send NULL */
    actual = INT_CMwrite_raw(conn, header_vec, NULL, 2, header_vec[0].iov_len + header_vec[1].iov_len, NULL, 1);
    free(attr_str);
    if (actual != 1) { 
	free(header_vec);
	return NULL;
    }

    tmp_vec = NULL;
    size_t each = (size + vecs - 1) / vecs;
    for (i=0; i <repeat_count; i++) {
	if (tmp_vec == NULL) {
	    tmp_vec = malloc(sizeof(tmp_vec[0]) * (vecs + 2));  /* at least 2 */
	    tmp_vec[0].iov_len = 5 * sizeof(int); /* body header */
	    for (count = 0; count < vecs; count++) {
		tmp_vec[count+1].iov_base = calloc(each + repeat_count, 1);
		tmp_vec[count+1].iov_len = each;
	    }
	    for (count = 0; count < vecs; count++) {
		/* for each vector, give it unique data */
		int j;
		for (j=0; j < ((each + repeat_count) /sizeof(int)); j++) {
		    ((int*)tmp_vec[count+1].iov_base)[j] = rand();
		}
	    }
	    if (tmp_vec[1].iov_len > tmp_vec[0].iov_len) {
	      tmp_vec[1].iov_len -= tmp_vec[0].iov_len;
	    } else {
	      tmp_vec[1].iov_len = 1;  /* just so there's something */
	    }
	}
	tmp_vec[0].iov_base = malloc(5 * sizeof(int)); /* body header */
	((int*)tmp_vec[0].iov_base)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
	((int*)tmp_vec[0].iov_base)[1] = (CMPerfTestBody<<24);
#else
	((int*)tmp_vec[0].iov_base)[1] = ((size >> 32) &0xffffff) | (CMPerfTestBody<<24);
#endif
	((int*)tmp_vec[0].iov_base)[2] = (size & 0xffffffff);
	((int*)tmp_vec[0].iov_base)[3] = i;   /* sequence number */
	((int*)tmp_vec[0].iov_base)[4] = node_id;   /* node_id */
	if (vecs > 1) {
	    /* if more than one vec, handle rounding */
	    tmp_vec[vecs].iov_len = size - (each * (vecs-1));
	}
	write_vec = malloc(sizeof(write_vec[0]) * (vecs + 2));  /* at least 3 */
	memcpy(write_vec, tmp_vec, sizeof(write_vec[0]) * (vecs + 2));
	for (count = 0; count < vecs; count++) {
	    /* On each iteration, increment the write base for each buffer by 1 */
//	    write_vec[count+1].iov_base += i;
	}
	write_data = malloc(sizeof(struct _free_struct));
	write_data->write_vec = write_vec;
	if ((i == (repeat_count-1)) || (!reuse_write_buffer)){
	    /* free this when done */
	    write_data->tmp_vec = tmp_vec;
	    write_data->vecs = vecs;
	} else {
	    write_data->tmp_vec = NULL;
	}
	actual = INT_CMwrite_raw_notify(conn, write_vec, NULL, vecs+1, size, 
					NULL, 0, write_is_done, (void*)write_data);
	if ((i == (repeat_count-1)) || (!reuse_write_buffer)){
	    /* free this when done */
	    tmp_vec = NULL;
	}

	if (actual != 1) {
	    free(tmp_vec);
	    return NULL;
	}
	if (conn->write_pending) {
	    wait_for_pending_write(conn);
	}
    }
    ((int*)header)[1] = 0 | (CMPerfTestEnd<<24);
    ((int*)header)[2] = sizeof(header);
    if (!tmp_vec) tmp_vec = malloc(sizeof(tmp_vec[0]));
    tmp_vec[0].iov_base = &header[0];
    tmp_vec[0].iov_len = sizeof(header);
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, sizeof(header), NULL, 0);
    free(tmp_vec);
    free(header_vec);
    if (actual != 1) {
	return NULL;
    }

    int ret = INT_CMCondition_wait(conn->cm, cond);
    if (ret) {
      CMtrace_out(cm, CMTransportVerbose, "CM - Completed transport test - result %p \n", result);
    } else {
      CMtrace_out(cm, CMTransportVerbose, "CM - Completed transport test CONNECTION FAILED- result %p \n", result);
    }
    return result;
}